

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Walk.cpp
# Opt level: O2

void Handlers::Walk_Admin(Character *character,PacketReader *reader)

{
  World *pWVar1;
  uint uVar2;
  int iVar3;
  mapped_type *this;
  allocator<char> local_49;
  key_type local_48;
  
  uVar2 = (*(character->super_Command_Source)._vptr_Command_Source[1])();
  pWVar1 = character->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"nowall",&local_49);
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar1->admin_config,&local_48);
  iVar3 = util::variant::GetInt(this);
  std::__cxx11::string::~string((string *)&local_48);
  if (iVar3 <= (int)(uVar2 & 0xff)) {
    walk_common(character,reader,0x1107be);
  }
  return;
}

Assistant:

void Walk_Admin(Character *character, PacketReader &reader)
{
	if (character->SourceDutyAccess() < int(character->world->admin_config["nowall"]))
		return;

	walk_common(character, reader, &Character::AdminWalk);
}